

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

bool lexer_CaptureRept(CaptureBody *capture)

{
  bool bVar1;
  int iVar2;
  int local_1c;
  long lStack_18;
  int c;
  size_t depth;
  CaptureBody *capture_local;
  
  startCapture(capture);
  lStack_18 = 0;
  if ((lexerState->atLineStart & 1U) == 0) {
    __assert_fail("lexerState->atLineStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x9ba,"lexer_CaptureRept");
  }
  do {
    nextLine();
    do {
      local_1c = nextChar();
      bVar1 = isWhitespace(local_1c);
    } while (bVar1);
    bVar1 = startsIdentifier(local_1c);
    if (bVar1) {
      iVar2 = readIdentifier((char)local_1c);
      if (iVar2 - 0x73U < 2) {
        lStack_18 = lStack_18 + 1;
      }
      else if (iVar2 == 0x7b) {
        if (lStack_18 == 0) {
          lexerState->captureSize = lexerState->captureSize - 4;
LAB_0011111e:
          endCapture(capture);
          lexerState->atLineStart = false;
          return local_1c != -1;
        }
        lStack_18 = lStack_18 + -1;
      }
    }
    while( true ) {
      if (local_1c == -1) {
        error("Unterminated REPT/FOR block\n");
        goto LAB_0011111e;
      }
      if ((local_1c == 10) || (local_1c == 0xd)) break;
      local_1c = nextChar();
    }
    handleCRLF(local_1c);
  } while( true );
}

Assistant:

bool lexer_CaptureRept(struct CaptureBody *capture)
{
	startCapture(capture);

	size_t depth = 0;
	int c = EOF;

	// Due to parser internals, it reads the EOL after the expression before calling this.
	// Thus, we don't need to keep one in the buffer afterwards.
	// The following assertion checks that.
	assert(lexerState->atLineStart);
	for (;;) {
		nextLine();
		// We're at line start, so attempt to match a `REPT` or `ENDR` token
		do { // Discard initial whitespace
			c = nextChar();
		} while (isWhitespace(c));
		// Now, try to match `REPT`, `FOR` or `ENDR` as a **whole** identifier
		if (startsIdentifier(c)) {
			switch (readIdentifier(c)) {
			case T_POP_REPT:
			case T_POP_FOR:
				depth++;
				// Ignore the rest of that line
				break;

			case T_POP_ENDR:
				if (!depth) {
					// The final ENDR has been captured, but we don't want it!
					// We know we have read exactly "ENDR", not e.g. an EQUS
					lexerState->captureSize -= strlen("ENDR");
					goto finish;
				}
				depth--;
			}
		}

		// Just consume characters until EOL or EOF
		for (;; c = nextChar()) {
			if (c == EOF) {
				error("Unterminated REPT/FOR block\n");
				goto finish;
			} else if (c == '\n' || c == '\r') {
				handleCRLF(c);
				break;
			}
		}
	}

finish:
	endCapture(capture);
	// ENDR or EOF puts us past the start of the line
	lexerState->atLineStart = false;

	// Returns true if an ENDR terminated the block, false if it reached EOF first
	return c != EOF;
}